

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operations.hpp
# Opt level: O2

Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> __thiscall
rc::shrinkable::walkPath<rc::detail::CaseDescription>
          (shrinkable *this,Shrinkable<rc::detail::CaseDescription> *shrinkable,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *path)

{
  size_t *psVar1;
  size_t index;
  bool bVar2;
  undefined8 extraout_RDX;
  size_t *psVar3;
  Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> MVar4;
  Shrinkable<rc::detail::CaseDescription> current;
  Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> s;
  Shrinkable<rc::detail::CaseDescription> local_50;
  _Head_base<0UL,_rc::Seq<rc::Shrinkable<rc::detail::CaseDescription>_>::ISeqImpl_*,_false> local_48
  ;
  Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> local_40;
  
  Shrinkable<rc::detail::CaseDescription>::Shrinkable(&local_50,shrinkable);
  psVar3 = (path->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (path->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (psVar3 == psVar1) {
      Maybe<rc::Shrinkable<rc::detail::CaseDescription>_>::Maybe
                ((Maybe<rc::Shrinkable<rc::detail::CaseDescription>_> *)this,&local_50);
      break;
    }
    index = *psVar3;
    Shrinkable<rc::detail::CaseDescription>::shrinks
              ((Shrinkable<rc::detail::CaseDescription> *)&local_48);
    rc::seq::at<rc::Shrinkable<rc::detail::CaseDescription>>
              ((seq *)&local_40,(Seq<rc::Shrinkable<rc::detail::CaseDescription>_> *)&local_48,index
              );
    if (local_48._M_head_impl != (ISeqImpl *)0x0) {
      (*(local_48._M_head_impl)->_vptr_ISeqImpl[3])();
    }
    bVar2 = local_40.m_initialized;
    local_48._M_head_impl = (ISeqImpl *)0x0;
    if (local_40.m_initialized == false) {
      this[8] = (shrinkable)0x0;
    }
    else {
      Shrinkable<rc::detail::CaseDescription>::operator=
                (&local_50,(Shrinkable<rc::detail::CaseDescription> *)&local_40);
    }
    Maybe<rc::Shrinkable<rc::detail::CaseDescription>_>::~Maybe(&local_40);
    psVar3 = psVar3 + 1;
  } while (bVar2 != false);
  Shrinkable<rc::detail::CaseDescription>::~Shrinkable(&local_50);
  MVar4._8_8_ = extraout_RDX;
  MVar4.m_storage = (Storage)this;
  return MVar4;
}

Assistant:

Maybe<Shrinkable<T>> walkPath(const Shrinkable<T> &shrinkable,
                              const std::vector<std::size_t> &path) {
  auto current = shrinkable;
  for (const auto i : path) {
    auto s = seq::at(current.shrinks(), i);
    if (!s) {
      return Nothing;
    }
    current = std::move(*s);
  }

  return current;
}